

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::getAttrDatatypeValidatorNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *localPart,XMLCh *typeURI)

{
  ulong uVar1;
  SchemaInfo **enclosingSchema;
  XMLCh XVar2;
  XMLCh XVar3;
  uint saveScope;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar4;
  ulong uVar5;
  SchemaInfo *pSVar6;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar7;
  XMLSize_t XVar8;
  long lVar9;
  int iVar10;
  DatatypeValidator *pDVar11;
  XMLCh *pXVar12;
  SchemaInfo *toRestore_00;
  DOMElement *childElem;
  XMLCh *pXVar13;
  ulong uVar14;
  XMLSize_t getAt;
  ListType aListType;
  bool bVar15;
  
  pDVar11 = getDatatypeValidator(this,typeURI,localPart);
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  pXVar12 = this->fTargetNSURIString;
  aListType = INCLUDE;
  if (pXVar12 == typeURI) goto LAB_0032d669;
  pXVar13 = typeURI;
  if (pXVar12 == (XMLCh *)0x0 || typeURI == (XMLCh *)0x0) {
    if (typeURI == (XMLCh *)0x0) {
      if (pXVar12 == (XMLCh *)0x0) goto LAB_0032d669;
    }
    else {
      bVar15 = *typeURI == L'\0';
      if (!bVar15 || pXVar12 == (XMLCh *)0x0) goto LAB_0032d50b;
    }
LAB_0032d504:
    bVar15 = *pXVar12 == L'\0';
  }
  else {
    do {
      XVar2 = *pXVar13;
      if (XVar2 == L'\0') goto LAB_0032d504;
      XVar3 = *pXVar12;
      pXVar12 = pXVar12 + 1;
      pXVar13 = pXVar13 + 1;
    } while (XVar2 == XVar3);
    bVar15 = false;
  }
LAB_0032d50b:
  if (((typeURI == (XMLCh *)0x0) || (bVar15)) || (*typeURI == L'\0')) {
LAB_0032d669:
    if (pDVar11 == (DatatypeValidator *)0x0) {
      childElem = SchemaInfo::getTopLevelComponent
                            (*enclosingSchema,1,L"simpleType",localPart,enclosingSchema);
      if (childElem == (DOMElement *)0x0) {
        pDVar11 = (DatatypeValidator *)0x0;
      }
      else {
        pDVar11 = traverseSimpleTypeDecl(this,childElem,true,0);
      }
      if (toRestore != *enclosingSchema) {
        restoreSchemaInfo(this,toRestore,aListType,saveScope);
      }
    }
    return pDVar11;
  }
  iVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
  pVVar4 = this->fImportedNSList;
  if ((pVVar4 != (ValueVectorOf<int> *)0x0) && (uVar5 = pVVar4->fCurCount, uVar5 != 0)) {
    if (*pVVar4->fElemList != iVar10) {
      uVar14 = 0;
      do {
        if (uVar5 - 1 == uVar14) goto LAB_0032d5dd;
        uVar1 = uVar14 + 1;
        lVar9 = uVar14 + 1;
        uVar14 = uVar1;
      } while (pVVar4->fElemList[lVar9] != iVar10);
      if (uVar5 <= uVar1) goto LAB_0032d5dd;
    }
    if (pDVar11 != (DatatypeValidator *)0x0) {
      return pDVar11;
    }
    pSVar6 = *enclosingSchema;
    pRVar7 = pSVar6->fImportedInfoList;
    if ((pRVar7 != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) &&
       (XVar8 = (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount, XVar8 != 0)) {
      getAt = 0;
      do {
        toRestore_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                 (&pSVar6->fImportedInfoList->
                                   super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
        if (toRestore_00->fTargetNSURI == iVar10) {
          if (toRestore_00->fProcessed != true) {
            aListType = IMPORT;
            restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
            goto LAB_0032d669;
          }
          break;
        }
        getAt = getAt + 1;
      } while (XVar8 != getAt);
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,typeURI,localPart,
                      (XMLCh *)0x0,(XMLCh *)0x0);
    return (DatatypeValidator *)0x0;
  }
LAB_0032d5dd:
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,typeURI,(XMLCh *)0x0,
                    (XMLCh *)0x0,(XMLCh *)0x0);
  return (DatatypeValidator *)0x0;
}

Assistant:

DatatypeValidator*
TraverseSchema::getAttrDatatypeValidatorNS(const DOMElement* const elem,
                                           const XMLCh* localPart,
                                           const XMLCh* typeURI)
{
    DatatypeValidator*   dv = getDatatypeValidator(typeURI, localPart);
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    SchemaInfo*          saveInfo = fSchemaInfo;
    unsigned int         saveScope = fCurrentScope;

    if (!XMLString::equals(typeURI, fTargetNSURIString)
        && (typeURI && *typeURI)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(typeURI);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, typeURI);
            return 0;
        }

        if (!dv) {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, typeURI, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }

    if (!dv) {

        DOMElement* typeElem = fSchemaInfo->getTopLevelComponent
        (
            SchemaInfo::C_SimpleType
            , SchemaSymbols::fgELT_SIMPLETYPE
            , localPart
            , &fSchemaInfo
        );

        if (typeElem)
            dv = traverseSimpleTypeDecl(typeElem);

        // restore schema information, if necessary
        if (saveInfo != fSchemaInfo) {
            restoreSchemaInfo(saveInfo, infoType, saveScope);
        }
    }

    return dv;
}